

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::XmlReporter::Result(XmlReporter *this,AssertionResult *assertionResult)

{
  uint uVar1;
  OfType OVar2;
  IConfig *pIVar3;
  string *text;
  AssertionResult *this_00;
  AssertionResult *in_RSI;
  long in_RDI;
  bool bVar4;
  AssertionResult *in_stack_fffffffffffffb78;
  XmlWriter *in_stack_fffffffffffffb80;
  allocator *paVar5;
  AssertionResult *in_stack_fffffffffffffb88;
  XmlWriter *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffba0;
  XmlWriter *in_stack_fffffffffffffba8;
  XmlWriter *in_stack_fffffffffffffbb0;
  string local_398 [39];
  allocator local_371;
  string local_370 [40];
  string local_348 [39];
  allocator local_321;
  string local_320 [40];
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [40];
  string local_2a8 [79];
  XmlWriter local_259;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [40];
  string local_1b8 [39];
  allocator local_191;
  string local_190 [40];
  string local_168 [39];
  allocator local_141;
  string local_140 [87];
  allocator local_e9;
  string local_e8 [79];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [48];
  Ptr<Catch::IConfig> local_18;
  AssertionResult *local_10;
  
  local_10 = in_RSI;
  ReporterConfig::fullConfig((ReporterConfig *)in_stack_fffffffffffffb78);
  pIVar3 = Ptr<Catch::IConfig>::operator->(&local_18);
  uVar1 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[7])();
  bVar4 = false;
  if ((uVar1 & 1) == 0) {
    OVar2 = AssertionResult::getResultType(local_10);
    bVar4 = OVar2 == Ok;
  }
  Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)in_stack_fffffffffffffb80);
  if (!bVar4) {
    bVar4 = AssertionResult::hasExpression((AssertionResult *)0x18a5d3);
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"Expression",&local_49);
      XmlWriter::startElement(in_stack_fffffffffffffb80,(string *)in_stack_fffffffffffffb78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"success",&local_71);
      AssertionResult::succeeded((AssertionResult *)0x18a682);
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88,
                 SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"filename",&local_99);
      AssertionResult::getSourceInfo(in_stack_fffffffffffffb78);
      XmlWriter::writeAttribute
                (in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88,
                 (string *)in_stack_fffffffffffffb80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"line",&local_e9);
      AssertionResult::getSourceInfo(in_stack_fffffffffffffb78);
      XmlWriter::writeAttribute<unsigned_long>
                (in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88,
                 (unsigned_long *)in_stack_fffffffffffffb80);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18a79e);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18a7c5);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"Original",&local_141);
      XmlWriter::scopedElement(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
      AssertionResult::getExpression_abi_cxx11_(in_stack_fffffffffffffb88);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88,
                 SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
      std::__cxx11::string::~string(local_168);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb80);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"Expanded",&local_191);
      XmlWriter::scopedElement(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
      AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffb78);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88,
                 SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
      std::__cxx11::string::~string(local_1b8);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb80);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      bVar4 = AssertionResult::succeeded((AssertionResult *)0x18a9a8);
      *(bool *)(in_RDI + 0x20) = (*(byte *)(in_RDI + 0x20) & 1 & bVar4) != 0;
    }
    OVar2 = AssertionResult::getResultType(local_10);
    if (1 < (uint)(OVar2 + Info)) {
      if (OVar2 == Info) {
        paVar5 = &local_2d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d0,"Info",paVar5);
        XmlWriter::scopedElement(in_stack_fffffffffffffba8,(string *)paVar5);
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb78);
        XmlWriter::ScopedElement::writeText
                  ((ScopedElement *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88,
                   SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
        std::__cxx11::string::~string(local_2f8);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb80);
        std::__cxx11::string::~string(local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      }
      else if (OVar2 == Warning) {
        text = (string *)(in_RDI + 0x28);
        paVar5 = &local_321;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_320,"Warning",paVar5);
        XmlWriter::scopedElement(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
        AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb78);
        XmlWriter::ScopedElement::writeText
                  ((ScopedElement *)paVar5,text,SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
        std::__cxx11::string::~string(local_348);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb80);
        std::__cxx11::string::~string(local_320);
        std::allocator<char>::~allocator((allocator<char> *)&local_321);
      }
      else if (1 < (uint)(OVar2 + 0xfffffff0)) {
        if (OVar2 == ExplicitFailure) {
          this_00 = (AssertionResult *)(in_RDI + 0x28);
          paVar5 = &local_371;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_370,"Failure",paVar5);
          XmlWriter::scopedElement(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
          AssertionResult::getMessage_abi_cxx11_(this_00);
          XmlWriter::ScopedElement::writeText
                    ((ScopedElement *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88,
                     SUB81((ulong)paVar5 >> 0x38,0));
          std::__cxx11::string::~string(local_398);
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)paVar5);
          std::__cxx11::string::~string(local_370);
          std::allocator<char>::~allocator((allocator<char> *)&local_371);
          *(undefined1 *)(in_RDI + 0x20) = 0;
        }
        else if ((OVar2 != Exception) && (OVar2 == ThrewException)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1e0,"Exception",&local_1e1);
          XmlWriter::scopedElement(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_208,"filename",&local_209);
          AssertionResult::getSourceInfo(in_stack_fffffffffffffb78);
          XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                    ((ScopedElement *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb80);
          in_stack_fffffffffffffbb0 = &local_259;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_259.m_needsNewline,"line",
                     (allocator *)in_stack_fffffffffffffbb0);
          AssertionResult::getSourceInfo(in_stack_fffffffffffffb78);
          XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                    ((ScopedElement *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88,
                     (unsigned_long *)in_stack_fffffffffffffb80);
          AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffb78);
          XmlWriter::ScopedElement::writeText
                    ((ScopedElement *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88,
                     SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
          std::__cxx11::string::~string(local_2a8);
          SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18ae69);
          std::__cxx11::string::~string((string *)&local_259.m_needsNewline);
          std::allocator<char>::~allocator((allocator<char> *)&local_259);
          SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18ae90);
          std::__cxx11::string::~string(local_208);
          std::allocator<char>::~allocator((allocator<char> *)&local_209);
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb80);
          std::__cxx11::string::~string(local_1e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
          *(undefined1 *)(in_RDI + 0x20) = 0;
        }
      }
    }
    bVar4 = AssertionResult::hasExpression((AssertionResult *)0x18b451);
    if (bVar4) {
      XmlWriter::endElement(in_stack_fffffffffffffbb0);
    }
  }
  return;
}

Assistant:

virtual void Result( const Catch::AssertionResult& assertionResult ) {
            if( !m_config.fullConfig()->includeSuccessfulResults() && assertionResult.getResultType() == ResultWas::Ok )
                return;

            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
                m_currentTestSuccess &= assertionResult.succeeded();
            }

            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    m_currentTestSuccess = false;
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    m_xml.scopedElement( "Warning" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    m_currentTestSuccess = false;
                    break;
                case ResultWas::Unknown:
                case ResultWas::Ok:
                case ResultWas::FailureBit:
                case ResultWas::ExpressionFailed:
                case ResultWas::Exception:
                case ResultWas::DidntThrowException:
                    break;
            }
            if( assertionResult.hasExpression() )
                m_xml.endElement();
        }